

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger default_delegate_tointeger(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  bool bVar2;
  SQInteger SVar3;
  SQRESULT SVar4;
  HSQUIRRELVM in_RDI;
  SQObjectPtr res;
  SQInteger base;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_ffffffffffffff38;
  HSQUIRRELVM in_stack_ffffffffffffff40;
  SQInteger *in_stack_ffffffffffffff48;
  SQInteger in_stack_ffffffffffffff50;
  HSQUIRRELVM in_stack_ffffffffffffff58;
  SQObjectPtr *in_stack_ffffffffffffff60;
  SQChar *in_stack_ffffffffffffff68;
  SQObjectPtr local_78;
  SQObjectPtr local_68;
  int local_54;
  SQObjectPtr local_50 [2];
  SQObjectPtr local_30;
  undefined8 local_20;
  SQObjectPtr *local_18;
  HSQUIRRELVM local_10;
  
  local_10 = in_RDI;
  local_18 = stack_get(in_stack_ffffffffffffff40,(SQInteger)in_stack_ffffffffffffff38);
  local_20 = 10;
  SVar3 = sq_gettop(local_10);
  if (1 < SVar3) {
    sq_getinteger(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  SVar1 = (local_18->super_SQObject)._type;
  if (SVar1 == OT_BOOL) {
    SQObjectPtr::SQObjectPtr
              (&local_78,(ulong)((local_18->super_SQObject)._unVal.pTable != (SQTable *)0x0));
    SQVM::Push(local_10,in_stack_ffffffffffffff38);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_10);
  }
  else if ((SVar1 == OT_INTEGER) || (SVar1 == OT_FLOAT)) {
    if ((local_18->super_SQObject)._type == OT_FLOAT) {
      SVar3 = (SQInteger)(local_18->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar3 = (local_18->super_SQObject)._unVal.nInteger;
    }
    SQObjectPtr::SQObjectPtr(&local_68,SVar3);
    SQVM::Push(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
  }
  else if (SVar1 == OT_STRING) {
    SQObjectPtr::SQObjectPtr(&local_30);
    bVar2 = str2num(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                    (SQInteger)in_stack_ffffffffffffff58);
    if (bVar2) {
      if (local_30.super_SQObject._type == OT_FLOAT) {
        SVar3 = (SQInteger)local_30.super_SQObject._unVal.fFloat;
      }
      else {
        SVar3 = CONCAT44(local_30.super_SQObject._unVal.nInteger._4_4_,
                         local_30.super_SQObject._unVal.fFloat);
      }
      SQObjectPtr::SQObjectPtr(local_50,SVar3);
      SQVM::Push(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
      local_54 = 2;
    }
    else {
      local_54 = 0;
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
    if (local_54 == 0) {
      SVar4 = sq_throwerror(in_stack_ffffffffffffff40,(SQChar *)in_stack_ffffffffffffff38);
      return SVar4;
    }
  }
  else {
    SQVM::PushNull((SQVM *)0x1473c9);
  }
  return 1;
}

Assistant:

static SQInteger default_delegate_tointeger(HSQUIRRELVM v)
{
    SQObjectPtr &o=stack_get(v,1);
    SQInteger base = 10;
    if(sq_gettop(v) > 1) {
        sq_getinteger(v,2,&base);
    }
    switch(sq_type(o)){
    case OT_STRING:{
        SQObjectPtr res;
        if(str2num(_stringval(o),res,base)){
            v->Push(SQObjectPtr(tointeger(res)));
            break;
        }}
        return sq_throwerror(v, _SC("cannot convert the string"));
        break;
    case OT_INTEGER:case OT_FLOAT:
        v->Push(SQObjectPtr(tointeger(o)));
        break;
    case OT_BOOL:
        v->Push(SQObjectPtr(_integer(o)?(SQInteger)1:(SQInteger)0));
        break;
    default:
        v->PushNull();
        break;
    }
    return 1;
}